

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O3

ScenarioUpperBound * __thiscall
despot::Chain::CreateScenarioUpperBound(Chain *this,string *name,string particle_bound_name)

{
  int iVar1;
  ParticleUpperBound *this_00;
  undefined **ppuVar2;
  ostream *poVar3;
  
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    this_00 = (ParticleUpperBound *)operator_new(0x10);
    despot::TrivialParticleUpperBound::TrivialParticleUpperBound
              ((TrivialParticleUpperBound *)this_00,&this->super_DSPOMDP);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 == 0) {
      this_00 = (ParticleUpperBound *)operator_new(8);
      despot::ParticleUpperBound::ParticleUpperBound(this_00);
      ppuVar2 = &PTR__ParticleUpperBound_0010ec10;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)name);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)name);
        if (iVar1 != 0) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Unsupported base upper bound: ");
          poVar3 = std::operator<<(poVar3,(string *)name);
          std::endl<char,std::char_traits<char>>(poVar3);
          exit(1);
        }
      }
      this_00 = (ParticleUpperBound *)operator_new(8);
      despot::ParticleUpperBound::ParticleUpperBound(this_00);
      ppuVar2 = &PTR__ParticleUpperBound_0010ec60;
    }
    *(undefined ***)this_00 = ppuVar2;
  }
  return (ScenarioUpperBound *)this_00;
}

Assistant:

ScenarioUpperBound* Chain::CreateScenarioUpperBound(string name,
	string particle_bound_name) const {
	if (name == "TRIVIAL") {
		return new TrivialParticleUpperBound(this);
	} else if (name == "LOOKAHEAD") {
		return new OneStepLookaheadChainParticleUpperBound(this);
	} else if (name == "MDP" || name == "DEFAULT") {
		return new ApproxMDPChainParticleUpperBound();
	} else {
		cerr << "Unsupported base upper bound: " << name << endl;
		exit(1);
		return NULL;
	}
}